

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Planner.cpp
# Opt level: O2

bool __thiscall Planner::Detect_Collision(Planner *this,Vec3i coordinates_)

{
  __normal_iterator<Vec3i_*,_std::vector<Vec3i,_std::allocator<Vec3i>_>_> _Var1;
  bool bVar2;
  long local_20;
  int local_18;
  
  local_18 = coordinates_.z;
  local_20 = coordinates_._0_8_;
  bVar2 = true;
  if ((((-1 < coordinates_.x) && (-1 < local_20 && coordinates_.x < (this->World_Size).x)) &&
      (coordinates_.y < (this->World_Size).y)) &&
     ((-1 < local_18 && (local_18 < (this->World_Size).z)))) {
    _Var1 = std::
            __find_if<__gnu_cxx::__normal_iterator<Vec3i*,std::vector<Vec3i,std::allocator<Vec3i>>>,__gnu_cxx::__ops::_Iter_equals_val<Vec3i_const>>
                      ((this->walls).super__Vector_base<Vec3i,_std::allocator<Vec3i>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (this->walls).super__Vector_base<Vec3i,_std::allocator<Vec3i>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_20);
    bVar2 = _Var1._M_current !=
            (this->walls).super__Vector_base<Vec3i,_std::allocator<Vec3i>_>._M_impl.
            super__Vector_impl_data._M_finish;
  }
  return bVar2;
}

Assistant:

bool Planner::Detect_Collision(Vec3i coordinates_) {
  if (coordinates_.x < 0 || coordinates_.x >= World_Size.x || coordinates_.y < 0
      || coordinates_.y >= World_Size.y || coordinates_.z < 0
      || coordinates_.z >= World_Size.z
      || std::find(walls.begin(), walls.end(), coordinates_) != walls.end()) {
    return true;  ///< return true of collision happens
  }
  return false;  ///< return false if collision doesn't happen
}